

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBTooSmallStrideTest *this,GLuint test_case_index)

{
  reference pvVar1;
  ostream *poVar2;
  GLchar *pGVar3;
  TestError *this_00;
  testCase *test_case;
  stringstream stream;
  ostream local_198;
  uint local_1c;
  XFBTooSmallStrideTest *pXStack_18;
  GLuint test_case_index_local;
  XFBTooSmallStrideTest *this_local;
  
  local_1c = test_case_index;
  pXStack_18 = this;
  this_local = (XFBTooSmallStrideTest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&test_case);
  pvVar1 = std::
           vector<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase>_>
           ::operator[](&this->m_test_cases,(ulong)local_1c);
  poVar2 = std::operator<<(&local_198,"Stage: ");
  pGVar3 = Utils::Shader::GetStageName(pvVar1->m_stage);
  poVar2 = std::operator<<(poVar2,pGVar3);
  std::operator<<(poVar2,", case: ");
  switch(pvVar1->m_case) {
  case OFFSET:
    std::operator<<(&local_198,"buffer stride: 40, vec4 offset: 32");
    break;
  case STRIDE:
    std::operator<<(&local_198,"buffer stride: 32, vec4 off 16 stride: 32");
    break;
  case BLOCK:
    std::operator<<(&local_198,"buffer stride: 32, block 3xvec4 offset 0");
    break;
  case ARRAY:
    std::operator<<(&local_198,"buffer stride: 32, vec4[4] offset 16");
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x5157);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&test_case);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBTooSmallStrideTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage) << ", case: ";

	switch (test_case.m_case)
	{
	case OFFSET:
		stream << "buffer stride: 40, vec4 offset: 32";
		break;
	case STRIDE:
		stream << "buffer stride: 32, vec4 off 16 stride: 32";
		break;
	case BLOCK:
		stream << "buffer stride: 32, block 3xvec4 offset 0";
		break;
	case ARRAY:
		stream << "buffer stride: 32, vec4[4] offset 16";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return stream.str();
}